

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var __thiscall
Js::RegexHelper::RegexReplaceImpl
          (RegexHelper *this,ScriptContext *scriptContext,RecyclableObject *thisObj,
          JavascriptString *input,RecyclableObject *replacefn)

{
  bool bVar1;
  Var pvVar2;
  ScriptContext *scriptContext_00;
  char16_t *varName;
  
  if (*(char *)(*(long *)(this + 0x1260) + 0x1d) == '\x01') {
    bVar1 = IsRegexSymbolReplaceObservable((RecyclableObject *)scriptContext,(ScriptContext *)this);
    if (bVar1) {
      pvVar2 = RegexEs6ReplaceImpl((ScriptContext *)this,(RecyclableObject *)scriptContext,
                                   (JavascriptString *)thisObj,&input->super_RecyclableObject);
      return pvVar2;
    }
  }
  varName = L"String.prototype.replace";
  if (*(char *)(*(long *)(this + 0x1260) + 0x1d) != '\0') {
    varName = L"RegExp.prototype[Symbol.replace]";
  }
  scriptContext_00 =
       (ScriptContext *)JavascriptRegExp::ToRegExp(scriptContext,varName,(ScriptContext *)this);
  pvVar2 = RegexEs5ReplaceImpl(this,scriptContext_00,(JavascriptRegExp *)thisObj,input,replacefn);
  return pvVar2;
}

Assistant:

Var RegexHelper::RegexReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, RecyclableObject* replacefn)
    {
        ScriptConfiguration const * scriptConfig = scriptContext->GetConfig();

        if (scriptConfig->IsES6RegExSymbolsEnabled() && IsRegexSymbolReplaceObservable(thisObj, scriptContext))
        {
            return RegexEs6ReplaceImpl(scriptContext, thisObj, input, replacefn);
        }
        else
        {
            PCWSTR varName = scriptConfig->IsES6RegExSymbolsEnabled()
                ? _u("RegExp.prototype[Symbol.replace]")
                : _u("String.prototype.replace");
            JavascriptRegExp* regularExpression = JavascriptRegExp::ToRegExp(thisObj, varName, scriptContext);
            return RegexEs5ReplaceImpl(scriptContext, regularExpression, input, replacefn);
        }
    }